

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alprd_analyze.hpp
# Opt level: O2

idx_t duckdb::AlpRDFinalAnalyze<float>(AnalyzeState *state)

{
  BlockManager *pBVar1;
  BlockManager *pBVar2;
  long lVar3;
  idx_t iVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  AlpRDAnalyzeState<float> *analyze_state;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  pBVar2 = state[1].info.block_manager;
  if (pBVar2 != (BlockManager *)0x0) {
    lVar5 = (long)state[3]._vptr_AnalyzeState - (long)state[2].info.block_manager;
    lVar6 = lVar5 >> 2;
    auVar10._8_4_ = (int)(lVar5 >> 0x22);
    auVar10._0_8_ = lVar6;
    auVar10._12_4_ = 0x45300000;
    auVar11._8_4_ = (int)((ulong)pBVar2 >> 0x20);
    auVar11._0_8_ = pBVar2;
    auVar11._12_4_ = 0x45300000;
    dVar8 = alp::AlpRDCompression<float,_true>::FindBestDictionary
                      ((vector<unsigned_int,_true> *)&state[2].info,(State *)(state + 4));
    lVar5 = (long)state[3]._vptr_AnalyzeState - (long)state[2].info.block_manager;
    lVar3 = lVar5 >> 2;
    auVar13._8_4_ = (int)(lVar5 >> 0x22);
    auVar13._0_8_ = lVar3;
    auVar13._12_4_ = 0x45300000;
    pBVar1 = state[1].info.block_manager;
    auVar14._8_4_ = (int)((ulong)pBVar1 >> 0x20);
    auVar14._0_8_ = pBVar1;
    auVar14._12_4_ = 0x45300000;
    dVar9 = ceil(((auVar14._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)pBVar1) - 4503599627370496.0)) * 0.0009765625);
    dVar9 = (double)((long)dVar9 & 0xffffffff) * 6.0 +
            ((auVar13._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) * dVar8 * 0.125 *
            (1.0 / (((auVar10._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) /
                   ((auVar11._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)pBVar2) - 4503599627370496.0))));
    iVar4 = CompressionInfo::GetBlockSize(&state->info);
    auVar12._8_4_ = (int)(iVar4 >> 0x20);
    auVar12._0_8_ = iVar4;
    auVar12._12_4_ = 0x45300000;
    dVar8 = ceil(dVar9 / ((auVar12._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)iVar4) - 4503599627370496.0) + -23.0));
    dVar9 = (double)((long)dVar8 & 0xffffffff) * 23.0 + dVar9;
    uVar7 = (ulong)dVar9;
    return (long)(dVar9 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f | uVar7;
  }
  return 0xffffffffffffffff;
}

Assistant:

idx_t AlpRDFinalAnalyze(AnalyzeState &state) {
	auto &analyze_state = (AlpRDAnalyzeState<T> &)state;
	if (analyze_state.total_values_count == 0) {
		return DConstants::INVALID_INDEX;
	}
	double factor_of_sampling = 1 / ((double)analyze_state.rowgroup_sample.size() / analyze_state.total_values_count);

	// Finding which is the best dictionary for the sample
	double estimated_bits_per_value =
	    alp::AlpRDCompression<T, true>::FindBestDictionary(analyze_state.rowgroup_sample, analyze_state.state);
	double estimated_compressed_bits = estimated_bits_per_value * analyze_state.rowgroup_sample.size();
	double estimed_compressed_bytes = estimated_compressed_bits / 8;

	//! Overhead per segment: [Pointer to metadata + right bitwidth + left bitwidth + n dict elems] + Dictionary Size
	double per_segment_overhead = AlpRDConstants::HEADER_SIZE + AlpRDConstants::MAX_DICTIONARY_SIZE_BYTES;

	//! Overhead per vector: Pointer to data + Exceptions count
	double per_vector_overhead = AlpRDConstants::METADATA_POINTER_SIZE + AlpRDConstants::EXCEPTIONS_COUNT_SIZE;

	uint32_t n_vectors = LossyNumericCast<uint32_t>(
	    std::ceil((double)analyze_state.total_values_count / AlpRDConstants::ALP_VECTOR_SIZE));

	auto estimated_size = (estimed_compressed_bytes * factor_of_sampling) + (n_vectors * per_vector_overhead);
	uint32_t estimated_n_blocks = LossyNumericCast<uint32_t>(
	    std::ceil(estimated_size / (static_cast<double>(state.info.GetBlockSize()) - per_segment_overhead)));

	auto final_analyze_size = estimated_size + (estimated_n_blocks * per_segment_overhead);
	return LossyNumericCast<idx_t>(final_analyze_size);
}